

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_striped_avx2_256_32.c
# Opt level: O0

parasail_result_t *
parasail_sw_table_striped_profile_avx2_256_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  int iVar1;
  long lVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  __m256i a;
  __m256i alVar9;
  __m256i c;
  __m256i vH_00;
  __m256i vH_01;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  __m256i *palVar14;
  int iVar15;
  uint seglen;
  int iVar16;
  __m256i *ptr;
  uint in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [64];
  int32_t temp;
  int32_t column_len;
  int32_t *t;
  __m256i *pv_2;
  __m256i *pv_1;
  __m256i vCompare;
  __m256i *pv;
  __m256i *vP;
  __m256i vH;
  __m256i vF;
  __m256i vE;
  parasail_result_t *result;
  int32_t maxp;
  __m256i vMaxHUnit;
  __m256i vMaxH;
  int32_t score;
  __m256i vNegInf;
  __m256i vZero;
  __m256i vGapE;
  __m256i vGapO;
  __m256i *pvE;
  __m256i *pvHMax;
  __m256i *pvHLoad;
  __m256i *pvHStore;
  __m256i *vProfile;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int32_t s1Len;
  int32_t end_ref;
  int32_t end_query;
  int32_t k;
  int32_t j;
  int32_t i;
  undefined8 in_stack_fffffffffffff6a0;
  int32_t in_stack_fffffffffffff6a8;
  uint in_stack_fffffffffffff6ac;
  undefined4 in_stack_fffffffffffff6b0;
  uint t_00;
  undefined4 uVar20;
  undefined4 in_stack_fffffffffffff6c0;
  undefined4 in_stack_fffffffffffff6c4;
  undefined8 in_stack_fffffffffffff6c8;
  __m256i *palVar21;
  longlong in_stack_fffffffffffff6d0;
  undefined1 local_920 [32];
  long lStack_908;
  __m256i local_8e0;
  undefined1 local_8c0 [32];
  longlong local_8a0;
  longlong lStack_898;
  longlong lStack_890;
  longlong lStack_888;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined1 local_840 [32];
  uint local_804;
  __m256i *local_768;
  __m256i *local_760;
  __m256i *local_758;
  int local_730;
  int local_72c;
  int local_728;
  int local_724;
  int local_720;
  parasail_result_t *local_700;
  ulong uStack_6d8;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  
  if (in_RDI == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_table_striped_profile_avx2_256_32","profile");
    local_700 = (parasail_result_t *)0x0;
  }
  else if (*(long *)(in_RDI + 0x48) == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_table_striped_profile_avx2_256_32",
            "profile->profile32.score");
    local_700 = (parasail_result_t *)0x0;
  }
  else if (*(long *)(in_RDI + 0x10) == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_table_striped_profile_avx2_256_32",
            "profile->matrix");
    local_700 = (parasail_result_t *)0x0;
  }
  else if (*(int *)(in_RDI + 8) < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_table_striped_profile_avx2_256_32",
            "profile->s1Len");
    local_700 = (parasail_result_t *)0x0;
  }
  else if (in_RSI == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_table_striped_profile_avx2_256_32","s2");
    local_700 = (parasail_result_t *)0x0;
  }
  else if (in_EDX < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_table_striped_profile_avx2_256_32","s2Len");
    local_700 = (parasail_result_t *)0x0;
  }
  else if ((int)in_ECX < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_table_striped_profile_avx2_256_32","open");
    local_700 = (parasail_result_t *)0x0;
  }
  else if ((int)in_R8D < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_table_striped_profile_avx2_256_32","gap");
    local_700 = (parasail_result_t *)0x0;
  }
  else {
    local_730 = 0;
    local_72c = *(int *)(in_RDI + 8);
    lVar2 = *(long *)(in_RDI + 0x10);
    iVar15 = (local_72c + 7) / 8;
    lVar3 = *(long *)(in_RDI + 0x48);
    auVar4 = vpinsrd_avx(ZEXT416(in_ECX),in_ECX,1);
    auVar4 = vpinsrd_avx(auVar4,in_ECX,2);
    auVar4 = vpinsrd_avx(auVar4,in_ECX,3);
    auVar5 = vpinsrd_avx(ZEXT416(in_ECX),in_ECX,1);
    auVar5 = vpinsrd_avx(auVar5,in_ECX,2);
    auVar5 = vpinsrd_avx(auVar5,in_ECX,3);
    uStack_170 = auVar5._0_8_;
    uStack_168 = auVar5._8_8_;
    auVar5 = vpinsrd_avx(ZEXT416(in_R8D),in_R8D,1);
    auVar5 = vpinsrd_avx(auVar5,in_R8D,2);
    auVar5 = vpinsrd_avx(auVar5,in_R8D,3);
    auVar18 = vpinsrd_avx(ZEXT416(in_R8D),in_R8D,1);
    auVar18 = vpinsrd_avx(auVar18,in_R8D,2);
    auVar18 = vpinsrd_avx(auVar18,in_R8D,3);
    uStack_130 = auVar18._0_8_;
    uStack_128 = auVar18._8_8_;
    uStack_6d8 = SUB328(ZEXT832(0),4);
    uVar20 = 0xc0000000;
    auVar18 = vpinsrd_avx(ZEXT416(0xc0000000),0xc0000000,1);
    auVar18 = vpinsrd_avx(auVar18,0xc0000000,2);
    auVar18 = vpinsrd_avx(auVar18,0xc0000000,3);
    auVar17 = vpinsrd_avx(ZEXT416(0xc0000000),0xc0000000,1);
    auVar17 = vpinsrd_avx(auVar17,0xc0000000,2);
    auVar17 = vpinsrd_avx(auVar17,0xc0000000,3);
    auVar17 = ZEXT116(0) * auVar18 + ZEXT116(1) * auVar17;
    auVar18 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar18;
    uStack_f0 = auVar18._0_8_;
    uStack_e8 = auVar18._8_8_;
    local_804 = 0xc0000000;
    local_840._16_8_ = uStack_f0;
    local_840._0_16_ = auVar17;
    local_840._24_8_ = uStack_e8;
    iVar16 = *(int *)(lVar2 + 0x1c);
    t_00 = in_ECX;
    local_700 = parasail_result_new_table1(iVar15 * 8,in_EDX);
    if (local_700 == (parasail_result_t *)0x0) {
      local_700 = (parasail_result_t *)0x0;
    }
    else {
      local_700->flag = local_700->flag | 0x8400804;
      local_700->flag = local_700->flag | 0x20000;
      local_758 = parasail_memalign___m256i(0x20,(long)iVar15);
      local_760 = parasail_memalign___m256i(0x20,(long)iVar15);
      local_768 = parasail_memalign___m256i(0x20,(long)iVar15);
      ptr = parasail_memalign___m256i(0x20,(long)iVar15);
      if (local_758 == (__m256i *)0x0) {
        local_700 = (parasail_result_t *)0x0;
      }
      else if (local_760 == (__m256i *)0x0) {
        local_700 = (parasail_result_t *)0x0;
      }
      else if (local_768 == (__m256i *)0x0) {
        local_700 = (parasail_result_t *)0x0;
      }
      else if (ptr == (__m256i *)0x0) {
        local_700 = (parasail_result_t *)0x0;
      }
      else {
        alVar9[0]._4_4_ = uVar20;
        alVar9[0]._0_4_ = in_R8D;
        alVar9[1]._0_4_ = in_stack_fffffffffffff6c0;
        alVar9[1]._4_4_ = in_stack_fffffffffffff6c4;
        alVar9[2] = in_stack_fffffffffffff6c8;
        alVar9[3] = in_stack_fffffffffffff6d0;
        parasail_memset___m256i(local_920._16_8_,alVar9,CONCAT44(t_00,in_stack_fffffffffffff6b0));
        seglen = -in_ECX;
        auVar6 = vpinsrd_avx(ZEXT416(seglen),seglen,1);
        auVar6 = vpinsrd_avx(auVar6,seglen,2);
        auVar6 = vpinsrd_avx(auVar6,seglen,3);
        auVar19 = ZEXT1664(auVar6);
        auVar6 = vpinsrd_avx(ZEXT416(seglen),seglen,1);
        auVar6 = vpinsrd_avx(auVar6,seglen,2);
        vpinsrd_avx(auVar6,seglen,3);
        c[0]._4_4_ = uVar20;
        c[0]._0_4_ = in_R8D;
        c[1]._0_4_ = in_stack_fffffffffffff6c0;
        c[1]._4_4_ = in_stack_fffffffffffff6c4;
        c[2] = in_stack_fffffffffffff6c8;
        c[3] = in_stack_fffffffffffff6d0;
        parasail_memset___m256i(local_920._16_8_,c,CONCAT44(t_00,seglen));
        local_724 = 0;
        while( true ) {
          palVar14 = local_758;
          palVar21 = local_768;
          uStack_848 = auVar18._8_8_;
          uStack_850 = auVar18._0_8_;
          if (in_EDX <= local_724) break;
          local_8c0 = ZEXT832(uStack_6d8) << 0x40;
          auVar8 = vperm2i128_avx2(auVar19._0_32_,(undefined1  [32])local_758[iVar15 + -1],0x28);
          local_8e0 = (__m256i)vpalignr_avx2((undefined1  [32])local_758[iVar15 + -1],auVar8,0xc);
          iVar1 = *(int *)(*(long *)(lVar2 + 0x10) + (ulong)*(byte *)(in_RSI + local_724) * 4);
          if (local_730 == local_724 + -2) {
            local_768 = local_760;
            local_758 = palVar21;
          }
          else {
            local_758 = local_760;
          }
          local_760 = palVar14;
          for (local_720 = 0; local_720 < iVar15; local_720 = local_720 + 1) {
            auVar8 = vpaddd_avx2((undefined1  [32])local_8e0,
                                 *(undefined1 (*) [32])
                                  (lVar3 + (long)(iVar1 * iVar15) * 0x20 + (long)local_720 * 0x20));
            alVar9 = ptr[local_720];
            auVar8 = vpmaxsd_avx2(auVar8,(undefined1  [32])ptr[local_720]);
            auVar8 = vpmaxsd_avx2(auVar8,local_8c0);
            auVar8 = vpmaxsd_avx2(auVar8,ZEXT832(uStack_6d8) << 0x40);
            palVar21 = local_758 + local_720;
            local_8e0[0] = auVar8._0_8_;
            local_8e0[1] = auVar8._8_8_;
            local_8e0[2] = auVar8._16_8_;
            local_8e0[3] = auVar8._24_8_;
            (*palVar21)[0] = local_8e0[0];
            (*palVar21)[1] = local_8e0[1];
            (*palVar21)[2] = local_8e0[2];
            (*palVar21)[3] = local_8e0[3];
            vH_00[0]._4_4_ = uVar20;
            vH_00[0]._0_4_ = in_R8D;
            vH_00[1]._0_4_ = in_stack_fffffffffffff6c0;
            vH_00[1]._4_4_ = in_stack_fffffffffffff6c4;
            vH_00[2] = in_stack_fffffffffffff6c8;
            vH_00[3] = in_stack_fffffffffffff6d0;
            arr_store_si256(local_920._0_8_,vH_00,t_00,seglen,in_stack_fffffffffffff6ac,
                            in_stack_fffffffffffff6a8);
            local_840 = vpmaxsd_avx2(auVar8,local_840);
            auVar13._16_8_ = uStack_170;
            auVar13._0_16_ = auVar4;
            auVar13._24_8_ = uStack_168;
            auVar8 = vpsubd_avx2(auVar8,auVar13);
            auVar12._16_8_ = uStack_130;
            auVar12._0_16_ = auVar5;
            auVar12._24_8_ = uStack_128;
            auVar7 = vpsubd_avx2((undefined1  [32])alVar9,auVar12);
            auVar7 = vpmaxsd_avx2(auVar7,auVar8);
            palVar21 = ptr + local_720;
            local_8a0 = auVar7._0_8_;
            lStack_898 = auVar7._8_8_;
            lStack_890 = auVar7._16_8_;
            lStack_888 = auVar7._24_8_;
            (*palVar21)[0] = local_8a0;
            (*palVar21)[1] = lStack_898;
            (*palVar21)[2] = lStack_890;
            (*palVar21)[3] = lStack_888;
            auVar7._16_8_ = uStack_130;
            auVar7._0_16_ = auVar5;
            auVar7._24_8_ = uStack_128;
            auVar7 = vpsubd_avx2(local_8c0,auVar7);
            local_8c0 = vpmaxsd_avx2(auVar7,auVar8);
            local_8e0 = palVar14[local_720];
          }
          for (local_728 = 0; local_728 < 8; local_728 = local_728 + 1) {
            auVar8 = vperm2i128_avx2(auVar8,local_8c0,0x28);
            local_8c0 = vpalignr_avx2(local_8c0,auVar8,0xc);
            for (local_720 = 0; local_720 < iVar15; local_720 = local_720 + 1) {
              auVar8 = vpmaxsd_avx2((undefined1  [32])local_758[local_720],local_8c0);
              palVar21 = local_758 + local_720;
              local_8e0[0] = auVar8._0_8_;
              local_8e0[1] = auVar8._8_8_;
              local_8e0[2] = auVar8._16_8_;
              local_8e0[3] = auVar8._24_8_;
              (*palVar21)[0] = local_8e0[0];
              (*palVar21)[1] = local_8e0[1];
              (*palVar21)[2] = local_8e0[2];
              (*palVar21)[3] = local_8e0[3];
              vH_01[0]._4_4_ = uVar20;
              vH_01[0]._0_4_ = in_R8D;
              vH_01[1]._0_4_ = in_stack_fffffffffffff6c0;
              vH_01[1]._4_4_ = in_stack_fffffffffffff6c4;
              vH_01[2] = in_stack_fffffffffffff6c8;
              vH_01[3] = in_stack_fffffffffffff6d0;
              arr_store_si256(local_920._0_8_,vH_01,t_00,seglen,in_stack_fffffffffffff6ac,
                              in_stack_fffffffffffff6a8);
              local_840 = vpmaxsd_avx2(auVar8,local_840);
              auVar11._16_8_ = uStack_170;
              auVar11._0_16_ = auVar4;
              auVar11._24_8_ = uStack_168;
              auVar8 = vpsubd_avx2(auVar8,auVar11);
              auVar10._16_8_ = uStack_130;
              auVar10._0_16_ = auVar5;
              auVar10._24_8_ = uStack_128;
              local_8c0 = vpsubd_avx2(local_8c0,auVar10);
              auVar7 = vpcmpgtd_avx2(local_8c0,auVar8);
              if ((((((((((((((((((((((((((((((((auVar7 >> 7 & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0 &&
                                               (auVar7 >> 0xf & (undefined1  [32])0x1) ==
                                               (undefined1  [32])0x0) &&
                                              (auVar7 >> 0x17 & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0) &&
                                             (auVar7 >> 0x1f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (auVar7 >> 0x27 & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           (auVar7 >> 0x2f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (auVar7 >> 0x37 & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         (auVar7 >> 0x3f & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                        (auVar7 >> 0x47 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) &&
                                       (auVar7 >> 0x4f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar7 >> 0x57 & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) &&
                                     (auVar7 >> 0x5f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar7 >> 0x67 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (auVar7 >> 0x6f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                   ) && (auVar7 >> 0x77 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) && SUB321(auVar7 >> 0x7f,0) == '\0')
                                && (auVar7 >> 0x87 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                ) && (auVar7 >> 0x8f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                              (auVar7 >> 0x97 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                             (auVar7 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar7 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar7 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar7 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar7 >> 0xbf,0) == '\0') &&
                        (auVar7 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar7 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar7 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (auVar7 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar7 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   (auVar7 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar7 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  -1 < auVar7[0x1f]) goto LAB_00ce6c2c;
            }
          }
LAB_00ce6c2c:
          auVar8._16_8_ = uStack_850;
          auVar8._0_16_ = auVar17;
          auVar8._24_8_ = uStack_848;
          auVar19 = ZEXT3264(auVar8);
          local_920 = vpcmpgtd_avx2(local_840,auVar8);
          if ((((((((((((((((((((((((((((((((local_920 >> 7 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0 ||
                                           (local_920 >> 0xf & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (local_920 >> 0x17 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (local_920 >> 0x1f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (local_920 >> 0x27 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (local_920 >> 0x2f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (local_920 >> 0x37 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (local_920 >> 0x3f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (local_920 >> 0x47 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (local_920 >> 0x4f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (local_920 >> 0x57 & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                                 (local_920 >> 0x5f & (undefined1  [32])0x1) !=
                                 (undefined1  [32])0x0) ||
                                (local_920 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                ) || (local_920 >> 0x6f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                              (local_920 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(local_920 >> 0x7f,0) != '\0') ||
                            (local_920 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (local_920 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (local_920 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (local_920 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (local_920 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (local_920 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (local_920 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(local_920 >> 0xbf,0) != '\0') ||
                    (local_920 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (local_920 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (local_920 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (local_920 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (local_920 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (local_920 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (local_920 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              lStack_908 < 0) {
            a[1] = in_stack_fffffffffffff6a0;
            a[0] = 0xce6c9f;
            a[2]._0_4_ = in_stack_fffffffffffff6a8;
            a[2]._4_4_ = in_stack_fffffffffffff6ac;
            a[3]._0_4_ = seglen;
            a[3]._4_4_ = t_00;
            in_stack_fffffffffffff6ac = _mm256_hmax_epi32_rpl(a);
            local_804 = in_stack_fffffffffffff6ac;
            if (0x7fffffff - (iVar16 + 1) < (int)in_stack_fffffffffffff6ac) {
              local_700->flag = local_700->flag | 0x40;
              break;
            }
            auVar18 = vpinsrd_avx(ZEXT416(in_stack_fffffffffffff6ac),in_stack_fffffffffffff6ac,1);
            auVar18 = vpinsrd_avx(auVar18,in_stack_fffffffffffff6ac,2);
            auVar18 = vpinsrd_avx(auVar18,in_stack_fffffffffffff6ac,3);
            auVar19 = ZEXT1664(auVar18);
            auVar17 = vpinsrd_avx(ZEXT416(in_stack_fffffffffffff6ac),in_stack_fffffffffffff6ac,1);
            auVar17 = vpinsrd_avx(auVar17,in_stack_fffffffffffff6ac,2);
            auVar17 = vpinsrd_avx(auVar17,in_stack_fffffffffffff6ac,3);
            auVar17 = ZEXT116(0) * auVar18 + ZEXT116(1) * auVar17;
            auVar18 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar18;
            local_730 = local_724;
          }
          local_724 = local_724 + 1;
        }
        palVar21 = local_768;
        if (local_804 == 0x7fffffff) {
          local_700->flag = local_700->flag | 0x40;
        }
        iVar16 = parasail_result_is_saturated(local_700);
        if (iVar16 == 0) {
          if (local_730 == local_724 + -1) {
            local_768 = local_758;
            local_758 = palVar21;
          }
          else if (local_730 == local_724 + -2) {
            local_768 = local_760;
            local_760 = palVar21;
          }
          local_72c = local_72c + -1;
          palVar21 = local_768;
          for (local_720 = 0; local_720 < iVar15 * 8; local_720 = local_720 + 1) {
            if (((uint)(*palVar21)[0] == local_804) &&
               (iVar16 = local_720 / 8 + (local_720 % 8) * iVar15, iVar16 < local_72c)) {
              local_72c = iVar16;
            }
            palVar21 = (__m256i *)((long)*palVar21 + 4);
          }
        }
        else {
          local_804 = 0x7fffffff;
          local_72c = 0;
          local_730 = 0;
        }
        local_700->score = local_804;
        local_700->end_query = local_72c;
        local_700->end_ref = local_730;
        parasail_free(ptr);
        parasail_free(local_768);
        parasail_free(local_760);
        parasail_free(local_758);
      }
    }
  }
  return local_700;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m256i* restrict vProfile = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvE = NULL;
    __m256i vGapO;
    __m256i vGapE;
    __m256i vZero;
    __m256i vNegInf;
    int32_t score = 0;
    __m256i vMaxH;
    __m256i vMaxHUnit;
    int32_t maxp = 0;
    /*int32_t stop = 0;*/
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile = (__m256i*)profile->profile32.score;
    vGapO = _mm256_set1_epi32(open);
    vGapE = _mm256_set1_epi32(gap);
    vZero = _mm256_setzero_si256();
    vNegInf = _mm256_set1_epi32(NEG_INF);
    score = NEG_INF;
    vMaxH = vNegInf;
    vMaxHUnit = vNegInf;
    maxp = INT32_MAX - (int32_t)(matrix->max+1);
    /*stop = profile->stop == INT32_MAX ?  INT32_MAX : (int32_t)profile->stop;*/

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m256i(32, segLen);
    pvHLoad =  parasail_memalign___m256i(32, segLen);
    pvHMax = parasail_memalign___m256i(32, segLen);
    pvE = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMax) return NULL;
    if (!pvE) return NULL;

    /* initialize H and E */
    parasail_memset___m256i(pvHStore, vZero, segLen);
    parasail_memset___m256i(pvE, _mm256_set1_epi32(-open), segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vF;
        __m256i vH;
        const __m256i* vP = NULL;
        __m256i* pv = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop. */
        vF = vZero;

        /* load final segment of pvHStore and shift left by 4 bytes */
        vH = _mm256_load_si256(&pvHStore[segLen - 1]);
        vH = _mm256_slli_si256_rpl(vH, 4);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }
        else {
            /* Swap the 2 H buffers. */
            pv = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm256_add_epi32(vH, _mm256_load_si256(vP + i));
            vE = _mm256_load_si256(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm256_max_epi32(vH, vE);
            vH = _mm256_max_epi32(vH, vF);
            vH = _mm256_max_epi32(vH, vZero);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vMaxH = _mm256_max_epi32(vH, vMaxH);

            /* Update vE value. */
            vH = _mm256_sub_epi32(vH, vGapO);
            vE = _mm256_sub_epi32(vE, vGapE);
            vE = _mm256_max_epi32(vE, vH);
            _mm256_store_si256(pvE + i, vE);

            /* Update vF value. */
            vF = _mm256_sub_epi32(vF, vGapE);
            vF = _mm256_max_epi32(vF, vH);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            vF = _mm256_slli_si256_rpl(vF, 4);
            for (i=0; i<segLen; ++i) {
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi32(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
                arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vMaxH = _mm256_max_epi32(vH, vMaxH);
                vH = _mm256_sub_epi32(vH, vGapO);
                vF = _mm256_sub_epi32(vF, vGapE);
                if (! _mm256_movemask_epi8(_mm256_cmpgt_epi32(vF, vH))) goto end;
                /*vF = _mm256_max_epi32(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 4);
            }
            result->rowcols->score_row[j] = (int32_t) _mm256_extract_epi32_rpl (vH, 7);
        }
#endif

        {
            __m256i vCompare = _mm256_cmpgt_epi32(vMaxH, vMaxHUnit);
            if (_mm256_movemask_epi8(vCompare)) {
                score = _mm256_hmax_epi32_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm256_set1_epi32(score);
                end_ref = j;
            }
        }

        /*if (score == stop) break;*/
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    if (score == INT32_MAX) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = INT32_MAX;
        end_query = 0;
        end_ref = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            __m256i *pv = pvHMax;
            pvHMax = pvHStore;
            pvHStore = pv;
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            __m256i *pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pv;
        }
        /* Trace the alignment ending position on read. */
        {
            int32_t *t = (int32_t*)pvHMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len - 1;
            for (i = 0; i<column_len; ++i, ++t) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                    }
                }
            }
        }
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvE);
    parasail_free(pvHMax);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}